

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLineStripPointsIndiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  uint uVar1;
  uint uVar2;
  AdjacencyGrid *pAVar3;
  AdjacencyGridPoint *pAVar4;
  GLfloat *pGVar5;
  GLfloat *pGVar6;
  uint *puVar7;
  GLfloat *pGVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  pAVar3 = test_data->m_grid;
  uVar1 = (pAVar3->m_line_strip).m_n_points;
  test_data->m_n_vertices = uVar1;
  uVar13 = (uVar1 * 8 + -0x18) * this->m_n_components_output;
  test_data->m_geometry_bo_size = uVar13;
  uVar14 = uVar1 * 4;
  uVar12 = this->m_n_components_input * uVar14;
  test_data->m_vertex_data_bo_size = uVar12;
  test_data->m_index_data_bo_size = uVar14;
  pGVar5 = (GLfloat *)operator_new__((ulong)uVar13);
  test_data->m_expected_adjacency_geometry = pGVar5;
  pGVar6 = (GLfloat *)operator_new__((ulong)uVar13);
  test_data->m_expected_geometry = pGVar6;
  puVar7 = (uint *)operator_new__((ulong)uVar14);
  test_data->m_index_data = puVar7;
  pGVar8 = (GLfloat *)operator_new__((ulong)uVar12);
  test_data->m_vertex_data = pGVar8;
  for (lVar11 = 0; puVar9 = puVar7, uVar12 = uVar1, (ulong)uVar1 * 0xc - lVar11 != 0;
      lVar11 = lVar11 + 0xc) {
    pAVar4 = (pAVar3->m_line_strip).m_points;
    *pGVar8 = *(GLfloat *)((long)&pAVar4->x + lVar11);
    pGVar8[1] = *(GLfloat *)((long)&pAVar4->y + lVar11);
    pGVar8 = pGVar8 + 2;
  }
  while (uVar12 = uVar12 - 1, uVar12 != 0xffffffff) {
    *puVar9 = uVar12;
    puVar9 = puVar9 + 1;
  }
  lVar11 = 0;
  for (uVar10 = 3; uVar10 - (uVar1 - 3) != 3; uVar10 = uVar10 + 1) {
    pAVar4 = (pAVar3->m_line_strip).m_points;
    uVar12 = puVar7[uVar10 - 3];
    uVar13 = puVar7[uVar10 - 2];
    uVar14 = puVar7[(int)uVar10 - 1];
    uVar2 = puVar7[uVar10 & 0xffffffff];
    *(GLfloat *)((long)pGVar5 + lVar11) = pAVar4[uVar12].x;
    *(GLfloat *)((long)pGVar5 + lVar11 + 4) = pAVar4[uVar12].y;
    *(undefined8 *)((long)pGVar5 + lVar11 + 8) = 0x3f80000000000000;
    *(GLfloat *)((long)pGVar5 + lVar11 + 0x10) = pAVar4[uVar2].x;
    *(GLfloat *)((long)pGVar5 + lVar11 + 0x14) = pAVar4[uVar2].y;
    *(undefined8 *)((long)pGVar5 + lVar11 + 0x18) = 0x3f80000000000000;
    *(GLfloat *)((long)pGVar6 + lVar11) = pAVar4[uVar13].x;
    *(GLfloat *)((long)pGVar6 + lVar11 + 4) = pAVar4[uVar13].y;
    *(undefined8 *)((long)pGVar6 + lVar11 + 8) = 0x3f80000000000000;
    *(GLfloat *)((long)pGVar6 + lVar11 + 0x10) = pAVar4[uVar14].x;
    *(GLfloat *)((long)pGVar6 + lVar11 + 0x14) = pAVar4[uVar14].y;
    *(undefined8 *)((long)pGVar6 + lVar11 + 0x18) = 0x3f80000000000000;
    lVar11 = lVar11 + 0x20;
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLineStripPointsIndiced(AdjacencyTestData& test_data)
{

	float*		  travellerExpectedAdjacencyGeometryPtr = 0;
	float*		  travellerExpectedGeometryPtr			= 0;
	unsigned int* travellerIndicesPtr					= 0;
	float*		  travellerPtr							= 0;

	/* Set buffer sizes */
	test_data.m_n_vertices		 = test_data.m_grid->m_line_strip.m_n_points;
	test_data.m_geometry_bo_size = static_cast<glw::GLuint>((test_data.m_n_vertices - 3) * m_n_components_output *
															2 /* start/end */ * sizeof(float));
	test_data.m_vertex_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input * sizeof(float));
	test_data.m_index_data_bo_size = static_cast<glw::GLuint>(test_data.m_n_vertices * sizeof(unsigned int));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_index_data					= new unsigned int[test_data.m_index_data_bo_size / sizeof(unsigned int)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerIndicesPtr					  = test_data.m_index_data;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected value s*/
	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerPtr;
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerIndicesPtr = (test_data.m_n_vertices - n - 1);
		++travellerIndicesPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices - 3; ++n)
	{
		AdjacencyGridPoint* pointN0 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n];
		AdjacencyGridPoint* pointN1 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 1];
		AdjacencyGridPoint* pointN2 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 2];
		AdjacencyGridPoint* pointN3 = test_data.m_grid->m_line_strip.m_points + test_data.m_index_data[n + 3];

		*travellerExpectedAdjacencyGeometryPtr = pointN0->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN0->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN3->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = pointN3->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = pointN1->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN1->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN2->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = pointN2->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all vertices apart from the three last ones) */
}